

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotation.cpp
# Opt level: O2

string * __thiscall
iDynTree::Rotation::toString_abi_cxx11_(string *__return_storage_ptr__,Rotation *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [392];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::ostream::_M_insert<double>((this->super_Matrix3x3).m_data[0]);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>((this->super_Matrix3x3).m_data[1]);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>((this->super_Matrix3x3).m_data[2]);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<double>((this->super_Matrix3x3).m_data[3]);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>((this->super_Matrix3x3).m_data[4]);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>((this->super_Matrix3x3).m_data[5]);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<double>((this->super_Matrix3x3).m_data[6]);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>((this->super_Matrix3x3).m_data[7]);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>((this->super_Matrix3x3).m_data[8]);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string Rotation::toString() const
    {
        std::stringstream ss;

        ss << this->m_data[0]
        << " " << this->m_data[1]
        << " " << this->m_data[2] << std::endl;
        ss << this->m_data[3]
        << " " << this->m_data[4]
        << " " << this->m_data[5] << std::endl;
        ss << this->m_data[6]
        << " " << this->m_data[7]
        << " " << this->m_data[8] << std::endl;

        return ss.str();
    }